

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

bool pugi::impl::(anonymous_namespace)::set_value_integer<unsigned_long_long,char*,unsigned_long>
               (char **dest,unsigned_long *header,uintptr_t header_mask,unsigned_long_long value,
               bool negative)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  uintptr_t uVar6;
  undefined8 uStack_50;
  char_t buf [64];
  
  uVar6 = -header_mask;
  if ((int)value == 0) {
    uVar6 = header_mask;
  }
  lVar1 = 0x3f;
  uVar5 = (ulong)((int)value + 1U & 1) ^ 0xffffffffffffffc1;
  do {
    uVar4 = uVar5;
    lVar3 = lVar1;
    buf[lVar3] = (byte)(uVar6 % 10) | 0x30;
    uVar5 = uVar4 + 1;
    bVar2 = 9 < uVar6;
    lVar1 = lVar3 + -1;
    uVar6 = uVar6 / 10;
  } while (bVar2);
  buf[lVar3 + -1] = '-';
  uStack_50 = 0x11e6bb;
  bVar2 = strcpy_insitu<char*,unsigned_long>(dest,header,0x10,buf + -uVar5,uVar4 + 0x41);
  return bVar2;
}

Assistant:

PUGI_IMPL_FN bool set_value_integer(String& dest, Header& header, uintptr_t header_mask, U value, bool negative)
	{
		char_t buf[64];
		char_t* end = buf + sizeof(buf) / sizeof(buf[0]);
		char_t* begin = integer_to_string(buf, end, value, negative);

		return strcpy_insitu(dest, header, header_mask, begin, end - begin);
	}